

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O1

void __thiscall GibbsSamplerFromHDP::calculateLogLikelihood(GibbsSamplerFromHDP *this)

{
  iterator __position;
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double logLikelihood;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  probabilityMatrix;
  double local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  (*this->_vptr_GibbsSamplerFromHDP[8])(this,1);
  local_80 = 0.0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_60,&this->_thetaEx);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_78,&this->_phiEx);
  dot<double>(&local_48,&local_60,&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_60);
  if (this->_J != 0) {
    uVar4 = 0;
    do {
      if ((this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] != 0) {
        uVar3 = 0;
        do {
          if (this->_K != 0) {
            uVar2 = 0;
            do {
              dVar5 = log(local_48.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [*(uint *)(*(long *)&(this->_xji).
                                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data + uVar3 * 4)]);
              local_80 = dVar5 + local_80;
              uVar2 = uVar2 + 1;
            } while (uVar2 < this->_K);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < (this->_nj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar4]);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->_J);
  }
  poVar1 = std::ostream::_M_insert<double>(local_80);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  __position._M_current =
       (this->_logLikelihood).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_logLikelihood).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->_logLikelihood,__position,&local_80);
  }
  else {
    *__position._M_current = local_80;
    (this->_logLikelihood).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void GibbsSamplerFromHDP::calculateLogLikelihood(){//{{{
    this->calculateExpectations(true);
    double logLikelihood = 0;
    vector<vector<double> > probabilityMatrix = dot(_thetaEx, _phiEx);
    for(int j=0; j<_J; j++){
        for(int i=0; i<_nj[j]; i++){
            for(int k=0; k<_K; k++){
                logLikelihood += log(probabilityMatrix[j][_xji[j][i]]);
            }
        }
    }
    cout<<logLikelihood<<endl;
    _logLikelihood.push_back(logLikelihood);
}